

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O1

void alloc_cb(uv_handle_t *handle,size_t size,uv_buf_t *buf)

{
  buf->base = slab;
  buf->len = 1;
  return;
}

Assistant:

static void alloc_cb(uv_handle_t* handle,
                     size_t suggested_size,
                     uv_buf_t* buf) {
  static char slab[65536];
  CHECK_HANDLE(handle);
  ASSERT_LE(suggested_size, sizeof(slab));
  buf->base = slab;
  buf->len = sizeof(slab);
}